

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

TextureFormatInfo *
tcu::getTextureFormatInfo(TextureFormatInfo *__return_storage_ptr__,TextureFormat *format)

{
  ChannelType channelType;
  ChannelOrder order;
  int i;
  TextureSwizzle *pTVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  BVec4 chnMask;
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec2 cRange;
  bool local_6c [4];
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  Vec4 local_38;
  float local_20;
  float local_1c;
  
  channelType = format->type;
  if (channelType == SIGNED_INT_1010102_REV) {
    (__return_storage_ptr__->valueMin).m_data[0] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[1] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[2] = -512.0;
    (__return_storage_ptr__->valueMin).m_data[3] = -2.0;
    (__return_storage_ptr__->valueMax).m_data[0] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[1] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[2] = 511.0;
    (__return_storage_ptr__->valueMax).m_data[3] = 1.0;
    (__return_storage_ptr__->lookupScale).m_data[0] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[1] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[2] = 0.0009775171;
    (__return_storage_ptr__->lookupScale).m_data[3] = 0.33333334;
    fVar3 = 0.5;
    fVar4 = 0.5;
    fVar5 = 0.5;
    fVar6 = 0.5;
  }
  else {
    if (channelType == UNSIGNED_INT_1010102_REV) {
      (__return_storage_ptr__->valueMin).m_data[0] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[1] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[2] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[3] = 0.0;
      (__return_storage_ptr__->valueMax).m_data[0] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[1] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[2] = 1023.0;
      (__return_storage_ptr__->valueMax).m_data[3] = 3.0;
      fVar7 = 0.0009775171;
      fVar8 = 0.0009775171;
      fVar9 = 0.0009775171;
      fVar10 = 0.33333334;
    }
    else {
      order = format->order;
      if ((order != DS) && (order != D)) {
        if (channelType == UNORM_SHORT_5551 && order == RGBA) {
          (__return_storage_ptr__->valueMin).m_data[0] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[1] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[2] = 0.0;
          (__return_storage_ptr__->valueMin).m_data[3] = 0.5;
          *(undefined1 **)(__return_storage_ptr__->valueMax).m_data = &DAT_3f8000003f800000;
          (__return_storage_ptr__->valueMax).m_data[2] = 1.0;
          (__return_storage_ptr__->valueMax).m_data[3] = 1.5;
          *(undefined1 **)(__return_storage_ptr__->lookupScale).m_data = &DAT_3f8000003f800000;
          *(undefined1 **)((__return_storage_ptr__->lookupScale).m_data + 2) = &DAT_3f8000003f800000
          ;
          fVar3 = 0.0;
          fVar4 = 0.0;
          fVar5 = 0.0;
          fVar6 = 0.0;
          goto LAB_019ebbc5;
        }
        if (channelType == UNSIGNED_SHORT_565) {
          local_48.m_data[0] = 31.0;
          local_48.m_data[1] = 63.0;
          local_48.m_data[2] = 31.0;
          local_48.m_data[3] = 0.0;
          local_58.m_data[1] = 0.015873017;
        }
        else {
          if (channelType != UNSIGNED_SHORT_5551) {
            getFloatChannelValueRange(channelType);
            pTVar1 = getChannelReadSwizzle(order);
            local_6c[0] = pTVar1->components[0] < CHANNEL_ZERO;
            local_6c[1] = pTVar1->components[1] < CHANNEL_ZERO;
            local_6c[2] = pTVar1->components[2] < CHANNEL_ZERO;
            local_6c[3] = pTVar1->components[3] < CHANNEL_ZERO;
            local_38.m_data[0] = 0.0;
            local_38.m_data[1] = 0.0;
            local_38.m_data[2] = 0.0;
            local_38.m_data[3] = 0.0;
            lVar2 = 0;
            do {
              fVar3 = local_20;
              if (local_6c[lVar2] == false) {
                fVar3 = 0.0;
              }
              local_38.m_data[lVar2] = fVar3;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 4);
            fVar3 = 1.0 / (local_1c - local_20);
            local_48.m_data[0] = 0.0;
            local_48.m_data[1] = 0.0;
            local_48.m_data[2] = 0.0;
            local_48.m_data[3] = 0.0;
            lVar2 = 0;
            do {
              fVar4 = local_1c;
              if (local_6c[lVar2] == false) {
                fVar4 = 0.0;
              }
              local_48.m_data[lVar2] = fVar4;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 4);
            local_58.m_data[0] = 0.0;
            local_58.m_data[1] = 0.0;
            local_58.m_data[2] = 0.0;
            local_58.m_data[3] = 0.0;
            lVar2 = 0;
            do {
              fVar4 = fVar3;
              if (local_6c[lVar2] == false) {
                fVar4 = 1.0;
              }
              local_58.m_data[lVar2] = fVar4;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 4);
            local_68.m_data[0] = 0.0;
            local_68.m_data[1] = 0.0;
            local_68.m_data[2] = 0.0;
            local_68.m_data[3] = 0.0;
            lVar2 = 0;
            do {
              fVar4 = fVar3 * -local_20;
              if (local_6c[lVar2] == false) {
                fVar4 = 0.0;
              }
              local_68.m_data[lVar2] = fVar4;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 4);
            goto LAB_019ebd84;
          }
          local_48.m_data[0] = 31.0;
          local_48.m_data[1] = 31.0;
          local_48.m_data[2] = 31.0;
          local_48.m_data[3] = 1.0;
          local_58.m_data[1] = 0.032258064;
        }
        local_38.m_data[2] = 0.0;
        local_38.m_data[3] = 0.0;
        local_38.m_data[0] = 0.0;
        local_38.m_data[1] = 0.0;
        local_58.m_data[0] = 0.032258064;
        local_58.m_data[2] = 0.032258064;
        local_58.m_data[3] = 1.0;
        local_68.m_data[0] = 0.0;
        local_68.m_data[1] = 0.0;
        local_68.m_data[2] = 0.0;
        local_68.m_data[3] = 0.0;
LAB_019ebd84:
        TextureFormatInfo::TextureFormatInfo
                  (__return_storage_ptr__,&local_38,&local_48,&local_58,&local_68);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->valueMin).m_data[0] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[1] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[2] = 0.0;
      (__return_storage_ptr__->valueMin).m_data[3] = 0.0;
      *(undefined1 **)(__return_storage_ptr__->valueMax).m_data = &DAT_3f8000003f800000;
      (__return_storage_ptr__->valueMax).m_data[2] = 1.0;
      (__return_storage_ptr__->valueMax).m_data[3] = 0.0;
      fVar7 = 1.0;
      fVar8 = 1.0;
      fVar9 = 1.0;
      fVar10 = 1.0;
    }
    fVar6 = 0.0;
    fVar5 = 0.0;
    fVar4 = 0.0;
    fVar3 = 0.0;
    (__return_storage_ptr__->lookupScale).m_data[0] = fVar7;
    (__return_storage_ptr__->lookupScale).m_data[1] = fVar8;
    (__return_storage_ptr__->lookupScale).m_data[2] = fVar9;
    (__return_storage_ptr__->lookupScale).m_data[3] = fVar10;
  }
LAB_019ebbc5:
  (__return_storage_ptr__->lookupBias).m_data[0] = fVar3;
  (__return_storage_ptr__->lookupBias).m_data[1] = fVar4;
  (__return_storage_ptr__->lookupBias).m_data[2] = fVar5;
  (__return_storage_ptr__->lookupBias).m_data[3] = fVar6;
  return __return_storage_ptr__;
}

Assistant:

TextureFormatInfo getTextureFormatInfo (const TextureFormat& format)
{
	// Special cases.
	if (format.type == TextureFormat::UNSIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f),
								 Vec4(	  1023.0f,		 1023.0f,		 1023.0f,		 3.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.0f,		    0.0f,		    0.0f,		 0.0f));
	if (format.type == TextureFormat::SIGNED_INT_1010102_REV)
		return TextureFormatInfo(Vec4(	  -512.0f,		 -512.0f,		 -512.0f,		-2.0f),
								 Vec4(	   511.0f,		  511.0f,		  511.0f,		 1.0f),
								 Vec4(1.0f/1023.f,	1.0f/1023.0f,	1.0f/1023.0f,	1.0f/3.0f),
								 Vec4(	     0.5f,		    0.5f,		    0.5f,		 0.5f));
	else if (format.order == TextureFormat::D || format.order == TextureFormat::DS)
		return TextureFormatInfo(Vec4(0.0f,	0.0f,	0.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	0.0f),
								 Vec4(1.0f,	1.0f,	1.0f,	1.0f),
								 Vec4(0.0f,	0.0f,	0.0f,	0.0f)); // Depth / stencil formats.
	else if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_SHORT_5551))
		return TextureFormatInfo(Vec4(0.0f, 0.0f, 0.0f, 0.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.5f),
								 Vec4(1.0f, 1.0f, 1.0f, 1.0f),
								 Vec4(0.0f, 0.0f, 0.0f, 0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_5551)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 31.0f,		 31.0f,	1.0f),
								 Vec4(1.0f/31.f,	1.0f/31.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));
	else if (format.type == TextureFormat::UNSIGNED_SHORT_565)
		return TextureFormatInfo(Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f),
								 Vec4(	  31.0f,		 63.0f,		 31.0f,	0.0f),
								 Vec4(1.0f/31.f,	1.0f/63.0f,	1.0f/31.0f,	1.0f),
								 Vec4(	   0.0f,		  0.0f,		  0.0f,	0.0f));

	const Vec2						cRange		= getFloatChannelValueRange(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const float						scale		= 1.0f / (cRange[1] - cRange[0]);
	const float						bias		= -cRange[0] * scale;

	return TextureFormatInfo(select(cRange[0],	0.0f, chnMask),
							 select(cRange[1],	0.0f, chnMask),
							 select(scale,		1.0f, chnMask),
							 select(bias,		0.0f, chnMask));
}